

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenStructOffsetAlias
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((struct_def->super_Definition).generated == false) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_f0,&this->namer_,struct_def);
    std::operator+(&local_130,"typealias ",&local_f0);
    std::operator+(&local_110,&local_130,"OffsetArray = OffsetArray<");
    std::operator+(&local_150,&local_110,&local_f0);
    std::operator+(&local_30,&local_150,">");
    CodeWriter::operator+=(writer,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&local_150);
    CodeWriter::operator+=(writer,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_b0,"inline fun ",&local_f0);
    std::operator+(&local_90,&local_b0,"OffsetArray(size: Int, crossinline call: (Int) -> Offset<");
    std::operator+(&local_130,&local_90,&local_f0);
    std::operator+(&local_110,&local_130,">): ");
    std::operator+(&local_150,&local_110,&local_f0);
    std::operator+(&local_70,&local_150,"OffsetArray =");
    CodeWriter::operator+=(writer,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
    std::operator+(&local_d0,&local_f0,"OffsetArray(IntArray(size) { call(it).value })");
    CodeWriter::operator+=(writer,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return;
}

Assistant:

void GenStructOffsetAlias(StructDef &struct_def, CodeWriter &writer) const {
    if (struct_def.generated) return;
    auto name = namer_.Type(struct_def);
    // This assumes offset as Ints always.
    writer += "typealias " + name + "OffsetArray = OffsetArray<" + name + ">";

    // public inline fun <T> MonsterOffsetArray(size: Int, crossinline call:
    // (Int) -> Offset<T>): OffsetArray<T> {
    //  return OffsetArray(IntArray(size) { call(it).value })
    // }
    writer += "";
    writer += "inline fun " + name +
              "OffsetArray(size: Int, crossinline call: (Int) -> Offset<" +
              name + ">): " + name + "OffsetArray =";
    writer.IncrementIdentLevel();
    writer += name + "OffsetArray(IntArray(size) { call(it).value })";
  }